

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreePatterns.cpp
# Opt level: O2

bool __thiscall
IRT::MemPattern::TryToGenerateCode
          (MemPattern *this,INode *tree,CTemp *dest,ChildrenTemps *children,
          AssemblyCommands *commands)

{
  CMemExpression *this_00;
  CExpression *pCVar1;
  CTempExpression *this_01;
  CTemp source;
  pair<IRT::CTemp,_const_IRT::INode_*> pStack_98;
  CTemp local_70;
  pair<IRT::CTemp,_const_IRT::CExpression_*> local_50;
  
  if (tree == (INode *)0x0) {
    return false;
  }
  this_00 = (CMemExpression *)__dynamic_cast(tree,&INode::typeinfo,&CMemExpression::typeinfo,0);
  if (this_00 != (CMemExpression *)0x0) {
    pCVar1 = CMemExpression::getAddress(this_00);
    if ((pCVar1 == (CExpression *)0x0) ||
       (this_01 = (CTempExpression *)
                  __dynamic_cast(pCVar1,&CExpression::typeinfo,&CTempExpression::typeinfo,0),
       this_01 == (CTempExpression *)0x0)) {
      CTemp::CTemp(&local_70);
      pCVar1 = CMemExpression::getAddress(this_00);
      std::__cxx11::string::string((string *)&local_50,(string *)&local_70);
      local_50.second = pCVar1;
      std::pair<IRT::CTemp,_const_IRT::INode_*>::pair<IRT::CTemp,_const_IRT::CExpression_*,_true>
                (&pStack_98,&local_50);
      std::
      vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
      ::emplace_back<std::pair<IRT::CTemp,IRT::INode_const*>>
                ((vector<std::pair<IRT::CTemp,IRT::INode_const*>,std::allocator<std::pair<IRT::CTemp,IRT::INode_const*>>>
                  *)children,&pStack_98);
      std::__cxx11::string::~string((string *)&pStack_98);
      std::__cxx11::string::~string((string *)&local_50);
      std::make_shared<AssemblyCode::MoveRegMemCommand,IRT::CTemp_const&,IRT::CTemp&>
                (&pStack_98.first,dest);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegMemCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands,(shared_ptr<AssemblyCode::MoveRegMemCommand> *)&pStack_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &pStack_98.first.name._M_string_length);
      std::__cxx11::string::~string((string *)&local_70);
    }
    else {
      CTempExpression::getTemprorary(this_01);
      std::make_shared<AssemblyCode::MoveRegMemCommand,IRT::CTemp_const&,IRT::CTemp_const&>
                (&pStack_98.first,dest);
      std::
      vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
      ::emplace_back<std::shared_ptr<AssemblyCode::MoveRegMemCommand>>
                ((vector<std::shared_ptr<AssemblyCode::AssemblyCommand>,std::allocator<std::shared_ptr<AssemblyCode::AssemblyCommand>>>
                  *)commands,(shared_ptr<AssemblyCode::MoveRegMemCommand> *)&pStack_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &pStack_98.first.name._M_string_length);
    }
    return true;
  }
  return false;
}

Assistant:

bool IRT::MemPattern::TryToGenerateCode( const IRT::INode *tree, const IRT::CTemp &dest, ChildrenTemps &children,
                                         AssemblyCommands &commands ) {
    ConstMemPtr memPtr = dynamic_cast<ConstMemPtr>(tree);
    if ( memPtr ) {
        ConstTempPtr constTempPtr = dynamic_cast<ConstTempPtr>(memPtr->getAddress( ));
        if ( constTempPtr ) {
            commands.emplace_back(
                    std::make_shared<AssemblyCode::MoveRegMemCommand>( dest, constTempPtr->getTemprorary( )));
        } else {
            CTemp source;
            children.push_back( std::make_pair( source, memPtr->getAddress( )));
            commands.emplace_back( std::make_shared<AssemblyCode::MoveRegMemCommand>( dest, source ));
        }
        return true;
    }
    return false;
}